

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_array_defs.h
# Opt level: O2

void __thiscall ON_ClassArray<ON_3dmView>::Append(ON_ClassArray<ON_3dmView> *this,ON_3dmView *x)

{
  int iVar1;
  int iVar2;
  ON_3dmView *pOVar3;
  ON_3dmView temp;
  ON_3dmView local_610;
  
  iVar1 = this->m_count;
  if (iVar1 == this->m_capacity) {
    iVar1 = NewCapacity(this);
    if (((this->m_a != (ON_3dmView *)0x0) &&
        (iVar2 = (int)(((long)x - (long)this->m_a) / 0x5f0), -1 < iVar2)) &&
       (iVar2 < this->m_capacity)) {
      ON_3dmView::ON_3dmView(&local_610);
      ON_3dmView::operator=(&local_610,x);
      Reserve(this,(long)iVar1);
      if (this->m_a == (ON_3dmView *)0x0) {
        ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_array_defs.h"
                   ,0x6bc,"","allocation failure");
      }
      else {
        iVar1 = this->m_count;
        this->m_count = iVar1 + 1;
        ON_3dmView::operator=(this->m_a + iVar1,&local_610);
      }
      ON_3dmView::~ON_3dmView(&local_610);
      return;
    }
    Reserve(this,(long)iVar1);
    pOVar3 = this->m_a;
    if (pOVar3 == (ON_3dmView *)0x0) {
      ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_array_defs.h"
                 ,0x6c6,"","allocation failure");
      return;
    }
    iVar1 = this->m_count;
  }
  else {
    pOVar3 = this->m_a;
  }
  this->m_count = iVar1 + 1;
  ON_3dmView::operator=(pOVar3 + iVar1,x);
  return;
}

Assistant:

void ON_ClassArray<T>::Append( const T& x ) 
{
  if ( m_count == m_capacity ) 
  {
    const int newcapacity = NewCapacity();
    if (m_a)
    {
      const int s = (int)(&x - m_a); // (int) cast is for 64 bit pointers
      if ( s >= 0 && s < m_capacity )
      {
        // 26 Sep 2005 Dale Lear
        //    User passed in an element of the m_a[]
        //    that will get reallocated by the call
        //    to Reserve(newcapacity).
        T temp;   // ON_*Array<> templates do not require robust copy constructor.
        temp = x; // ON_*Array<> templates require a robust operator=.
        Reserve( newcapacity );
        if (nullptr == m_a)
        {
          ON_ERROR("allocation failure");
          return;
        }
        m_a[m_count++] = temp;
        return;
      }
    }
    Reserve(newcapacity);
    if (nullptr == m_a)
    {
      ON_ERROR("allocation failure");
      return;
    }
  }
  m_a[m_count++] = x;
}